

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O1

bool __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::Contains(MemoryObject *this,MemoryObject *other)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (this->variable_inst_ == other->variable_inst_) {
    pAVar1 = (this->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pAVar2 - (long)pAVar1;
    pAVar3 = (other->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 <= (ulong)((long)(other->access_chain_).
                               super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3)) {
      bVar7 = pAVar2 == pAVar1;
      if (bVar7) {
        return bVar7;
      }
      if (pAVar3->is_result_id != pAVar1->is_result_id) {
        return bVar7;
      }
      if ((pAVar3->field_1).result_id != (pAVar1->field_1).result_id) {
        return bVar7;
      }
      uVar5 = (long)uVar5 >> 3;
      uVar6 = 1;
      while( true ) {
        bVar7 = uVar5 <= uVar6;
        if (uVar5 <= uVar6) {
          return bVar7;
        }
        if (pAVar3[uVar6].is_result_id != pAVar1[uVar6].is_result_id) break;
        pAVar2 = pAVar1 + uVar6;
        pAVar4 = pAVar3 + uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
        if ((pAVar4->field_1).result_id != (pAVar2->field_1).result_id) {
          return bVar7;
        }
      }
      return bVar7;
    }
  }
  return false;
}

Assistant:

Instruction* GetVariable() const { return variable_inst_; }